

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_update_tracker.h
# Opt level: O0

void __thiscall
absl::lts_20240722::cord_internal::CordzUpdateTracker::LossyAdd
          (CordzUpdateTracker *this,MethodIdentifier method,int64_t n)

{
  long lVar1;
  Counter *value;
  int64_t n_local;
  MethodIdentifier method_local;
  CordzUpdateTracker *this_local;
  memory_order __b_1;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  lVar1 = this->values_[method].super_atomic<long>.super___atomic_base<long>._M_i;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  this->values_[method].super_atomic<long>.super___atomic_base<long>._M_i = lVar1 + n;
  return;
}

Assistant:

void LossyAdd(MethodIdentifier method, int64_t n = 1) {
    auto& value = values_[method];
    value.store(value.load(std::memory_order_relaxed) + n,
                std::memory_order_relaxed);
  }